

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O1

int Au_ManMemUsageUseful(Au_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  iVar1 = (p->vNtks).nSize;
  iVar2 = 0;
  if (1 < (long)iVar1) {
    iVar2 = (p->vNtks).nSize;
    iVar3 = 1;
    if (1 < iVar2) {
      iVar3 = iVar2;
    }
    iVar2 = 0;
    lVar4 = 1;
    do {
      if (iVar3 - 1U <= iVar1 - 2U) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar2 = iVar2 + *(int *)((long)(p->vNtks).pArray[lVar4] + 0x88) * 0x10;
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
  }
  return iVar2;
}

Assistant:

int Au_ManMemUsageUseful( Au_Man_t * p )
{
    Au_Ntk_t * pNtk;
    int i, Mem = 0;
    Au_ManForEachNtk( p, pNtk, i )
        Mem += 16 * pNtk->nObjsUsed;
    return Mem;
}